

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPHandler.h
# Opt level: O0

void __thiscall HTTPHandler<Client>::handle(HTTPHandler<Client> *this,Client *client)

{
  error_code ec_00;
  error_code ec_01;
  error_code ec_02;
  bool bVar1;
  socket *psVar2;
  basic_string_view<char,_std::char_traits<char>_> x;
  string_view sVar3;
  error_code local_158;
  size_t local_148;
  undefined1 local_130 [8];
  send_lambda<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
  lambda;
  bool close;
  undefined1 local_d8 [8];
  request<http::string_body> request;
  flat_buffer buffer;
  error_code ec;
  Client *client_local;
  HTTPHandler<Client> *this_local;
  
  boost::system::error_code::error_code((error_code *)&buffer.max_);
  boost::beast::basic_flat_buffer<std::allocator<char>_>::basic_flat_buffer
            ((basic_flat_buffer<std::allocator<char>_> *)
             ((long)&request.
                     super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                     .value_.field_2 + 8));
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::message((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
             *)local_d8);
  psVar2 = Client::get_socket(client);
  boost::beast::http::
  read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::beast::basic_flat_buffer<std::allocator<char>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
            (psVar2,(basic_flat_buffer<std::allocator<char>_> *)
                    ((long)&request.
                            super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                            .value_.field_2 + 8),
             (message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)local_d8,(error_code *)&buffer.max_);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&buffer.max_);
  if (bVar1) {
    ec_02.cat_ = (error_category *)ec._0_8_;
    ec_02.val_ = (undefined4)buffer.max_;
    ec_02.failed_ = (bool)buffer.max_._4_1_;
    ec_02._5_3_ = buffer.max_._5_3_;
    fail(ec_02,"init-read");
  }
  else {
    sVar3 = boost::beast::http::
            header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>::method_string
                      ((header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_> *)
                       local_d8);
    x.len_ = (size_t)"CONNECT";
    x.ptr_ = (char *)sVar3.len_;
    bVar1 = boost::operator==((boost *)sVar3.ptr_,x,sVar3.ptr_);
    if (bVar1) {
      HTTPSHandler<Client>::
      handle<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                (&this->https_handler,client,
                 (request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                  *)local_d8);
    }
    else {
      lambda.ec_._7_1_ = 0;
      psVar2 = Client::get_socket(client);
      send_lambda<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
      ::send_lambda((send_lambda<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
                     *)local_130,psVar2,(bool *)((long)&lambda.ec_ + 7),(error_code *)&buffer.max_);
      do {
        save_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                  (this,(request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                         *)local_d8);
        send_response<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,send_lambda<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>&>
                  (this,(request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                         *)local_d8,
                   (send_lambda<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
                    *)local_130);
        bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&buffer.max_);
        if (bVar1) {
          local_148 = buffer.max_;
          ec_01.cat_ = (error_category *)ec._0_8_;
          ec_01.val_ = (undefined4)buffer.max_;
          ec_01.failed_ = (bool)buffer.max_._4_1_;
          ec_01._5_3_ = buffer.max_._5_3_;
          fail(ec_01,"write");
          goto LAB_0011a976;
        }
        if ((lambda.ec_._7_1_ & 1) != 0) goto LAB_0011a976;
        psVar2 = Client::get_socket(client);
        boost::beast::http::
        read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::beast::basic_flat_buffer<std::allocator<char>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                  (psVar2,(basic_flat_buffer<std::allocator<char>_> *)
                          ((long)&request.
                                  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                                  .value_.field_2 + 8),
                   (message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                    *)local_d8,(error_code *)&buffer.max_);
        boost::system::error_code::error_code<boost::beast::http::error>
                  (&local_158,end_of_stream,(type *)0x0);
        bVar1 = boost::system::operator==((error_code *)&buffer.max_,&local_158);
        if (bVar1) goto LAB_0011a976;
        bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&buffer.max_);
      } while (!bVar1);
      ec_00.cat_ = (error_category *)ec._0_8_;
      ec_00.val_ = (undefined4)buffer.max_;
      ec_00.failed_ = (bool)buffer.max_._4_1_;
      ec_00._5_3_ = buffer.max_._5_3_;
      fail(ec_00,"read");
    }
  }
LAB_0011a976:
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)local_d8);
  boost::beast::basic_flat_buffer<std::allocator<char>_>::~basic_flat_buffer
            ((basic_flat_buffer<std::allocator<char>_> *)
             ((long)&request.
                     super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                     .value_.field_2 + 8));
  return;
}

Assistant:

void HTTPHandler<T>::handle(T&& client) {
    beast::error_code ec;
    beast::flat_buffer buffer;
    http::request<http::string_body> request;

    http::read(client.get_socket(), buffer, request, ec);

    if (ec) {
        return fail(ec, "init-read");
    }

    // This means we've got https proxy request
    if (request.method_string() == "CONNECT") {
        https_handler.handle(std::move(client), request);
        return;
    }

    bool close = false;
    send_lambda<tcp::socket&> lambda{client.get_socket(), close, ec};
    for(;;) { 
        save_request(request);
        send_response(std::move(request), lambda);

        if (ec) {
            fail(ec, "write");
            return;
        }
        if (close) {
            return;
        }

        http::read(client.get_socket(), buffer, request, ec);

        if (ec == http::error::end_of_stream) {
            return;
        }
        if (ec) {
            fail(ec, "read");
            return;
        }
    }

}